

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryAdd<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>::dx
          (value_type *__return_storage_ptr__,
          FadBinaryAdd<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_> *this,int i)

{
  Fad<Fad<double>_> *pFVar1;
  value_type local_50;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> local_30;
  
  FadUnaryMin<Fad<Fad<double>_>_>::dx(&local_50,&this->left_->fadexpr_,i);
  pFVar1 = this->right_;
  local_30.fadexpr_.right_ = &pFVar1->defaultVal;
  if ((pFVar1->dx_).num_elts != 0) {
    local_30.fadexpr_.right_ = (pFVar1->dx_).ptr_to_data + i;
  }
  local_30.fadexpr_.left_ = &local_50;
  Fad<double>::Fad<FadBinaryAdd<Fad<double>,Fad<double>>>(__return_storage_ptr__,&local_30);
  Fad<double>::~Fad(&local_50);
  return __return_storage_ptr__;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) + right_.dx(i);}